

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::ListAllFields
               (FileDescriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  int iVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_RSI;
  FileDescriptor *in_RDI;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_00000008;
  Descriptor *in_stack_00000010;
  int i_1;
  int i;
  value_type *in_stack_ffffffffffffffc8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(in_RDI);
    if (iVar1 <= local_14) break;
    FileDescriptor::message_type(in_RDI,local_14);
    ListAllFields(in_stack_00000010,in_stack_00000008);
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    iVar1 = FileDescriptor::extension_count(in_RDI);
    if (iVar1 <= local_18) break;
    this = in_RSI;
    FileDescriptor::extension(in_RDI,local_18);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(this,in_stack_ffffffffffffffc8);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void ListAllFields(const FileDescriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect file level message.
  for (int i = 0; i < d->message_type_count(); i++) {
    ListAllFields(d->message_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
}